

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Contact.cc
# Opt level: O3

void __thiscall
RigidBodyDynamics::ContactConstraint::calcConstraintForces
          (ContactConstraint *this,Model *model,double time,VectorNd *Q,VectorNd *QDot,
          MatrixNd *GSys,VectorNd *LagrangeMultipliersSys,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *constraintBodiesUpd,
          vector<RigidBodyDynamics::Math::SpatialTransform,_std::allocator<RigidBodyDynamics::Math::SpatialTransform>_>
          *constraintBodyFramesUpd,
          vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *constraintForcesUpd,
          ConstraintCache *cache,bool resolveAllInRootFrame,bool updateKinematics)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  undefined8 *puVar1;
  undefined4 *puVar2;
  ConstraintCache *pCVar3;
  double *pdVar4;
  double dVar5;
  pointer puVar6;
  pointer pSVar7;
  pointer pSVar8;
  long lVar9;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  undefined4 uVar14;
  uint uVar15;
  undefined8 uVar16;
  double dVar17;
  double dVar18;
  ActualDstType actualDst;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  Matrix3d *pMVar22;
  void *__src;
  ConstraintCache *pCVar23;
  ActualDstType actualDst_1;
  byte bVar24;
  double dVar25;
  Matrix3d local_78;
  
  bVar24 = 0;
  __x = &(this->super_Constraint).bodyIds;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(constraintBodiesUpd,__x);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator=(&constraintBodyFramesUpd->
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
              ,&(this->super_Constraint).bodyFrames.
                super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             );
  CalcBodyToBaseCoordinates
            ((Vector3d *)&local_78,model,Q,
             *(this->super_Constraint).bodyIds.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,
             &((this->super_Constraint).bodyFrames.
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start)->r,updateKinematics);
  *(double *)(cache + 0x60) =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  *(double *)(cache + 0x50) =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  *(double *)(cache + 0x58) =
       local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  if (resolveAllInRootFrame) {
    puVar6 = (constraintBodiesUpd->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    *puVar6 = puVar6[1];
    pSVar7 = (constraintBodyFramesUpd->
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ).
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar11 = *(double *)(cache + 0x58);
    *(undefined8 *)
     &(pSVar7->r).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> =
         *(undefined8 *)(cache + 0x50);
    *(double *)((long)&(pSVar7->r).super_Vector3d + 8) = dVar11;
    *(double *)((long)&(pSVar7->r).super_Vector3d + 0x10) = *(double *)(cache + 0x60);
    pSVar7 = (constraintBodyFramesUpd->
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ).
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar11 = *(double *)((long)&pSVar7[1].E.super_Matrix3d + 8);
    dVar12 = *(double *)((long)&pSVar7[1].E.super_Matrix3d + 0x10);
    dVar25 = *(double *)((long)&pSVar7[1].E.super_Matrix3d + 0x18);
    dVar5 = *(double *)((long)&pSVar7[1].E.super_Matrix3d + 0x20);
    dVar13 = *(double *)((long)&pSVar7[1].E.super_Matrix3d + 0x28);
    dVar17 = *(double *)((long)&pSVar7[1].E.super_Matrix3d + 0x30);
    dVar18 = *(double *)((long)&pSVar7[1].E.super_Matrix3d + 0x38);
    *(undefined8 *)&(pSVar7->E).super_Matrix3d = *(undefined8 *)&pSVar7[1].E.super_Matrix3d;
    *(double *)((long)&(pSVar7->E).super_Matrix3d + 8) = dVar11;
    *(double *)((long)&(pSVar7->E).super_Matrix3d + 0x10) = dVar12;
    *(double *)((long)&(pSVar7->E).super_Matrix3d + 0x18) = dVar25;
    *(double *)((long)&(pSVar7->E).super_Matrix3d + 0x20) = dVar5;
    *(double *)((long)&(pSVar7->E).super_Matrix3d + 0x28) = dVar13;
    *(double *)((long)&(pSVar7->E).super_Matrix3d + 0x30) = dVar17;
    *(double *)((long)&(pSVar7->E).super_Matrix3d + 0x38) = dVar18;
    *(double *)((long)&(pSVar7->E).super_Matrix3d + 0x40) =
         *(double *)((long)&pSVar7[1].E.super_Matrix3d + 0x40);
  }
  pCVar3 = cache + 0x50;
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::resize
            (&constraintForcesUpd->
              super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>,
             (long)(this->super_Constraint).bodyIds.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->super_Constraint).bodyIds.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  lVar19 = (long)(this->super_Constraint).bodyIds.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->super_Constraint).bodyIds.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar19 != 0) {
    pSVar8 = (constraintForcesUpd->
             super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar21 = 1;
    uVar20 = 0;
    do {
      pdVar4 = (double *)
               ((long)&pSVar8[uVar20].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
      *pdVar4 = 0.0;
      pdVar4[1] = 0.0;
      pdVar4 = (double *)
               ((long)&pSVar8[uVar20].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
      *pdVar4 = 0.0;
      pdVar4[1] = 0.0;
      *(undefined8 *)
       &pSVar8[uVar20].super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> = 0;
      *(double *)
       ((long)&pSVar8[uVar20].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) = 0.0;
      uVar20 = (ulong)uVar21;
      uVar21 = uVar21 + 1;
    } while (uVar20 < (ulong)(lVar19 >> 2));
  }
  dVar11 = 0.0;
  dVar12 = 0.0;
  *(double *)pCVar3 = 0.0;
  *(undefined8 *)(cache + 0x58) = 0;
  *(undefined8 *)(cache + 0x60) = 0;
  if ((this->super_Constraint).sizeOfConstraint == 0) {
    dVar11 = 0.0;
  }
  else {
    dVar25 = 0.0;
    lVar19 = 0x10;
    uVar20 = 0;
    do {
      lVar9 = *(long *)&(this->super_Constraint).field_0xd8;
      dVar5 = (LagrangeMultipliersSys->
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
              [(this->super_Constraint).rowInSystem + (int)uVar20];
      pdVar4 = (double *)(lVar9 + -0x10 + lVar19);
      dVar11 = dVar11 + dVar5 * *pdVar4;
      dVar12 = dVar12 + dVar5 * pdVar4[1];
      auVar10._8_4_ = SUB84(dVar12,0);
      auVar10._0_8_ = dVar11;
      auVar10._12_4_ = (int)((ulong)dVar12 >> 0x20);
      *(undefined1 (*) [16])(cache + 0x50) = auVar10;
      dVar25 = dVar25 + dVar5 * *(double *)(lVar9 + lVar19);
      *(double *)(cache + 0x60) = dVar25;
      uVar20 = uVar20 + 1;
      lVar19 = lVar19 + 0x18;
    } while (uVar20 < (this->super_Constraint).sizeOfConstraint);
  }
  if (resolveAllInRootFrame) {
    pSVar8 = (constraintForcesUpd->
             super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    pdVar4 = (double *)
             ((long)&(pSVar8->super_Matrix<double,_6,_1,_0,_6,_1>).
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
    if (((ulong)pdVar4 & 7) == 0) {
      uVar21 = (uint)((ulong)pdVar4 >> 3) & 1;
      if (((ulong)pdVar4 >> 3 & 1) == 0) {
        uVar20 = (ulong)(uVar21 << 3);
        uVar16 = *(undefined8 *)(cache + uVar20 + 0x50 + 8);
        puVar1 = (undefined8 *)
                 ((long)&(pSVar8->super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                 uVar20 + 0x18);
        *puVar1 = *(undefined8 *)(cache + uVar20 + 0x50);
        puVar1[1] = uVar16;
        *(double *)
         ((long)&(pSVar8->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) =
             *(double *)(cache + 0x60);
      }
      else {
        *pdVar4 = dVar11;
        uVar20 = (ulong)(uVar21 << 3);
        uVar16 = *(undefined8 *)(pCVar3 + uVar20 + 8);
        puVar1 = (undefined8 *)((long)pdVar4 + uVar20);
        *puVar1 = *(undefined8 *)(pCVar3 + uVar20);
        puVar1[1] = uVar16;
      }
    }
    else {
      lVar19 = 0;
      do {
        pdVar4[lVar19] = *(double *)(pCVar3 + lVar19 * 8);
        lVar19 = lVar19 + 1;
      } while (lVar19 != 3);
    }
  }
  else {
    CalcBodyWorldOrientation
              (&local_78,model,Q,
               *(__x->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start,false);
    pMVar22 = &local_78;
    pCVar23 = cache + 0xe0;
    for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
      *(double *)pCVar23 =
           (pMVar22->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[0];
      pMVar22 = (Matrix3d *)((long)pMVar22 + ((ulong)bVar24 * -2 + 1) * 8);
      pCVar23 = pCVar23 + (ulong)bVar24 * -0x10 + 8;
    }
    pSVar8 = (constraintForcesUpd->
             super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    dVar25 = *(double *)(cache + 0x50);
    dVar5 = *(double *)(cache + 0x58);
    dVar13 = *(double *)(cache + 0x60);
    dVar11 = dVar13 * *(double *)(cache + 0x110) +
             dVar5 * *(double *)(cache + 0xf8) + dVar25 * *(double *)(cache + 0xe0);
    dVar12 = dVar13 * *(double *)(cache + 0x118) +
             dVar5 * *(double *)(cache + 0x100) + dVar25 * *(double *)(cache + 0xe8);
    local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[1]._0_4_ = SUB84(dVar12,0);
    local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[0] = dVar11;
    local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[1]._4_4_ = (int)((ulong)dVar12 >> 0x20);
    pdVar4 = (double *)
             ((long)&(pSVar8->super_Matrix<double,_6,_1,_0,_6,_1>).
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
    local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[2] =
         *(double *)(cache + 0x120) * dVar13 + *(double *)(cache + 0x108) * dVar5 +
         dVar25 * *(double *)(cache + 0xf0);
    if (((ulong)pdVar4 & 7) == 0) {
      uVar20 = (ulong)(((uint)((ulong)pdVar4 >> 3) & 1) * 8);
      __src = (void *)((long)local_78.super_Matrix3d.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array + uVar20);
      if (((ulong)pdVar4 >> 3 & 1) == 0) {
        memcpy((void *)((long)pdVar4 + uVar20),__src,0x10);
        *(double *)
         ((long)&(pSVar8->super_Matrix<double,_6,_1,_0,_6,_1>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) =
             local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[2];
      }
      else {
        *pdVar4 = dVar11;
        memcpy((void *)(uVar20 + (long)pdVar4),__src,0x10);
      }
    }
    else {
      *(double *)
       ((long)&(pSVar8->super_Matrix<double,_6,_1,_0,_6,_1>).
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) =
           local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[2];
      *pdVar4 = dVar11;
      *(double *)
       ((long)&(pSVar8->super_Matrix<double,_6,_1,_0,_6,_1>).
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20) =
           local_78.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array[1];
    }
  }
  pSVar8 = (constraintForcesUpd->
           super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>).
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (double *)
           ((long)&pSVar8[1].super_Matrix<double,_6,_1,_0,_6,_1>.
                   super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
  if (((ulong)pdVar4 & 7) == 0) {
    uVar21 = (uint)((ulong)pdVar4 >> 3) & 1;
    if (((ulong)pdVar4 >> 3 & 1) == 0) {
      uVar20 = (ulong)(uVar21 << 3);
      pCVar3 = cache + uVar20 + 0x50;
      uVar21 = *(uint *)(pCVar3 + 4);
      uVar14 = *(undefined4 *)(pCVar3 + 8);
      uVar15 = *(uint *)(pCVar3 + 0xc);
      puVar2 = (undefined4 *)
               ((long)&pSVar8[1].super_Matrix<double,_6,_1,_0,_6,_1>.
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + uVar20 + 0x18)
      ;
      *puVar2 = *(undefined4 *)pCVar3;
      puVar2[1] = uVar21 ^ 0x80000000;
      puVar2[2] = uVar14;
      puVar2[3] = uVar15 ^ 0x80000000;
      *(double *)
       ((long)&pSVar8[1].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28) =
           -*(double *)(cache + 0x60);
    }
    else {
      *pdVar4 = -*(double *)pCVar3;
      uVar20 = (ulong)(uVar21 << 3);
      pCVar3 = pCVar3 + uVar20;
      uVar21 = *(uint *)(pCVar3 + 4);
      uVar16 = *(undefined8 *)(pCVar3 + 8);
      puVar2 = (undefined4 *)((long)pdVar4 + uVar20);
      *puVar2 = *(undefined4 *)pCVar3;
      puVar2[1] = uVar21 ^ 0x80000000;
      puVar2[2] = (int)uVar16;
      puVar2[3] = (uint)((ulong)uVar16 >> 0x20) ^ 0x80000000;
    }
  }
  else {
    lVar19 = 0;
    do {
      pdVar4[lVar19] = -*(double *)(pCVar3 + lVar19 * 8);
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
  }
  return;
}

Assistant:

void ContactConstraint::calcConstraintForces( 
              Model &model,
              const double time,
              const Math::VectorNd &Q,
              const Math::VectorNd &QDot,
              const Math::MatrixNd &GSys,
              const Math::VectorNd &LagrangeMultipliersSys,
              std::vector< unsigned int > &constraintBodiesUpd,
              std::vector< Math::SpatialTransform > &constraintBodyFramesUpd,
              std::vector< Math::SpatialVector > &constraintForcesUpd,
              ConstraintCache &cache,
              bool resolveAllInRootFrame,
              bool updateKinematics)
{

  //Size the vectors of bodies, local frames, and spatial vectors
  constraintBodiesUpd       = bodyIds;
  constraintBodyFramesUpd   = bodyFrames;

  cache.vec3A = CalcBodyToBaseCoordinates(model,Q,bodyIds[0],bodyFrames[0].r,
                                    updateKinematics);

  if(resolveAllInRootFrame){
    constraintBodiesUpd[0] = constraintBodiesUpd[1];
    constraintBodyFramesUpd[0].r = cache.vec3A;
    constraintBodyFramesUpd[0].E = constraintBodyFramesUpd[1].E;
  }


  constraintForcesUpd.resize(bodyIds.size());
  for(unsigned int i=0; i< bodyIds.size(); ++i){
    constraintForcesUpd[i].setZero();
  }
  //Evaluate the total force the constraint applies to the contact point
  cache.vec3A.setZero();
  for(unsigned int i=0; i < sizeOfConstraint; ++i){
    //The only reason that we can use T here is that it is resolved
    //at the origin of the ground frame.
    cache.vec3A += T[i]*LagrangeMultipliersSys[rowInSystem+i];
  }

  //Update the forces applied to the body in the frame of the body
  if(resolveAllInRootFrame){
    constraintForcesUpd[0].block(3,0,3,1) = cache.vec3A;
  }else{
    cache.mat3A = CalcBodyWorldOrientation(model,Q,bodyIds[0],false);
    constraintForcesUpd[0].block(3,0,3,1) = cache.mat3A*cache.vec3A;
  }

  //Update the forces applied to the ground in the frame of the ground
  constraintForcesUpd[1].block(3,0,3,1) = -cache.vec3A;
}